

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_transform.cpp
# Opt level: O1

ScalarFunction * duckdb::ListTransformFun::GetFunction(void)

{
  long lVar1;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_f9;
  code *local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *pcStack_e0;
  LogicalType local_d0 [24];
  LogicalType local_b8 [24];
  LogicalType local_a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_88;
  LogicalType local_70 [24];
  LogicalType local_58 [24];
  LogicalType local_40 [24];
  
  duckdb::LogicalType::LogicalType(local_a0,ANY);
  duckdb::LogicalType::LIST(local_70);
  duckdb::LogicalType::LogicalType(local_58,LAMBDA);
  __l._M_len = 2;
  __l._M_array = local_70;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_88,__l,&local_f9);
  duckdb::LogicalType::LogicalType(local_d0,ANY);
  duckdb::LogicalType::LIST(local_b8);
  uStack_f0 = 0;
  local_f8 = LambdaFunctions::ListTransformFunction;
  pcStack_e0 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_40,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_40);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  duckdb::LogicalType::~LogicalType(local_b8);
  duckdb::LogicalType::~LogicalType(local_d0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_88);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_70 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::~LogicalType(local_a0);
  in_RDI->field_0xa9 = 1;
  in_RDI->serialize = ListLambdaBindData::Serialize;
  in_RDI->deserialize = ListLambdaBindData::Deserialize;
  in_RDI->bind_lambda = ListTransformBindLambda;
  return in_RDI;
}

Assistant:

ScalarFunction ListTransformFun::GetFunction() {
	ScalarFunction fun({LogicalType::LIST(LogicalType::ANY), LogicalType::LAMBDA}, LogicalType::LIST(LogicalType::ANY),
	                   LambdaFunctions::ListTransformFunction, ListTransformBind, nullptr, nullptr);

	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.serialize = ListLambdaBindData::Serialize;
	fun.deserialize = ListLambdaBindData::Deserialize;
	fun.bind_lambda = ListTransformBindLambda;

	return fun;
}